

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yarn3.hpp
# Opt level: O3

void __thiscall trng::yarn3::split(yarn3 *this,uint s,uint n)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  uint i_5;
  uint uVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  int iVar11;
  int32_t iVar12;
  uint i;
  uint uVar13;
  int iVar14;
  int32_t iVar15;
  bool bVar16;
  int32_t b [9];
  int32_t a [3];
  int local_68;
  int local_64;
  uint local_60;
  int32_t local_5c;
  int local_58;
  int local_54;
  int32_t local_50;
  int32_t local_4c;
  int local_48;
  int32_t local_40;
  int32_t iStack_3c;
  int local_38;
  
  if (s <= n) {
    std::invalid_argument::invalid_argument
              ((invalid_argument *)&local_68,"invalid argument for trng::yarn3::split");
    utility::throw_this<std::invalid_argument>((invalid_argument *)&local_68);
    std::invalid_argument::~invalid_argument((invalid_argument *)&local_68);
  }
  if (1 < s) {
    uVar4 = (ulong)n + 1;
    if (n < 0xf) {
      uVar13 = (this->S).r[0];
      uVar5 = (this->S).r[1];
      uVar6 = (this->S).r[2];
      do {
        uVar10 = uVar5;
        uVar5 = uVar13;
        uVar8 = (long)(int)uVar6 * (long)(this->P).a[2] + (long)(int)uVar10 * (long)(this->P).a[1] +
                (long)(int)uVar5 * (long)(this->P).a[0];
        uVar9 = (uVar8 >> 0x1f) + (uVar8 & 0x7fffffff);
        uVar8 = uVar9 - 0xfffffffe;
        if (uVar9 < 0xfffffffe) {
          uVar8 = uVar9;
        }
        uVar13 = (uint)uVar8 + 0x80000001;
        if (uVar8 < 0x7fffffff) {
          uVar13 = (uint)uVar8;
        }
        uVar1 = (int)uVar4 - 1;
        uVar4 = (ulong)uVar1;
        uVar6 = uVar10;
      } while (uVar1 != 0);
      (this->S).r[0] = uVar13;
      (this->S).r[1] = uVar5;
      (this->S).r[2] = uVar10;
    }
    else {
      uVar13 = 0;
      do {
        if ((uVar4 & 1) != 0) {
          jump2(this,uVar13);
        }
        uVar13 = uVar13 + 1;
        bVar16 = 1 < uVar4;
        uVar4 = uVar4 >> 1;
      } while (bVar16);
      uVar13 = (this->S).r[0];
    }
    uVar4 = (ulong)s;
    if (s < 0x10) {
      uVar8 = (ulong)uVar13;
      iVar3 = (this->S).r[1];
      iVar2 = (this->S).r[2];
      uVar5 = s;
      do {
        iVar7 = iVar3;
        iVar3 = (int)uVar8;
        uVar8 = (long)iVar2 * (long)(this->P).a[2] + (long)iVar7 * (long)(this->P).a[1] +
                (long)iVar3 * (long)(this->P).a[0];
        uVar8 = (uVar8 >> 0x1f) + (uVar8 & 0x7fffffff);
        uVar9 = uVar8 - 0xfffffffe;
        if (uVar8 < 0xfffffffe) {
          uVar9 = uVar8;
        }
        uVar8 = (ulong)((int)uVar9 + 0x80000001);
        if (uVar9 < 0x7fffffff) {
          uVar8 = uVar9 & 0xffffffff;
        }
        uVar5 = uVar5 - 1;
        iVar2 = iVar7;
      } while (uVar5 != 0);
      (this->S).r[0] = (int)uVar8;
      (this->S).r[1] = iVar3;
      (this->S).r[2] = iVar7;
    }
    else {
      uVar5 = 0;
      uVar8 = uVar4;
      do {
        if ((uVar8 & 1) != 0) {
          jump2(this,uVar5);
        }
        uVar5 = uVar5 + 1;
        bVar16 = 1 < uVar8;
        uVar8 = uVar8 >> 1;
      } while (bVar16);
      uVar8 = (ulong)(uint)(this->S).r[0];
    }
    iVar3 = (int)uVar8;
    if (s < 0x10) {
      iVar2 = (this->S).r[1];
      iVar7 = (this->S).r[2];
      uVar5 = s;
      do {
        iVar11 = iVar2;
        iVar2 = (int)uVar8;
        uVar8 = (long)iVar7 * (long)(this->P).a[2] + (long)iVar11 * (long)(this->P).a[1] +
                (long)iVar2 * (long)(this->P).a[0];
        uVar8 = (uVar8 >> 0x1f) + (uVar8 & 0x7fffffff);
        uVar9 = uVar8 - 0xfffffffe;
        if (uVar8 < 0xfffffffe) {
          uVar9 = uVar8;
        }
        uVar8 = (ulong)((int)uVar9 + 0x80000001);
        if (uVar9 < 0x7fffffff) {
          uVar8 = uVar9 & 0xffffffff;
        }
        uVar5 = uVar5 - 1;
        iVar7 = iVar11;
      } while (uVar5 != 0);
      (this->S).r[0] = (int)uVar8;
      (this->S).r[1] = iVar2;
      (this->S).r[2] = iVar11;
    }
    else {
      uVar5 = 0;
      uVar8 = uVar4;
      do {
        if ((uVar8 & 1) != 0) {
          jump2(this,uVar5);
        }
        uVar5 = uVar5 + 1;
        bVar16 = 1 < uVar8;
        uVar8 = uVar8 >> 1;
      } while (bVar16);
      uVar8 = (ulong)(uint)(this->S).r[0];
    }
    iVar2 = (int)uVar8;
    if (s < 0x10) {
      iVar7 = (this->S).r[1];
      iVar11 = (this->S).r[2];
      uVar5 = s;
      do {
        iVar14 = iVar7;
        iVar7 = (int)uVar8;
        uVar8 = (long)iVar11 * (long)(this->P).a[2] + (long)iVar14 * (long)(this->P).a[1] +
                (long)iVar7 * (long)(this->P).a[0];
        uVar8 = (uVar8 >> 0x1f) + (uVar8 & 0x7fffffff);
        uVar9 = uVar8 - 0xfffffffe;
        if (uVar8 < 0xfffffffe) {
          uVar9 = uVar8;
        }
        uVar8 = (ulong)((int)uVar9 + 0x80000001);
        if (uVar9 < 0x7fffffff) {
          uVar8 = uVar9 & 0xffffffff;
        }
        uVar5 = uVar5 - 1;
        iVar11 = iVar14;
      } while (uVar5 != 0);
      (this->S).r[0] = (int)uVar8;
      (this->S).r[1] = iVar7;
      (this->S).r[2] = iVar14;
    }
    else {
      uVar5 = 0;
      uVar8 = uVar4;
      do {
        if ((uVar8 & 1) != 0) {
          jump2(this,uVar5);
        }
        uVar5 = uVar5 + 1;
        bVar16 = 1 < uVar8;
        uVar8 = uVar8 >> 1;
      } while (bVar16);
      uVar8 = (ulong)(uint)(this->S).r[0];
    }
    iVar15 = (int32_t)uVar8;
    if (s < 0x10) {
      iVar7 = (this->S).r[1];
      iVar11 = (this->S).r[2];
      uVar5 = s;
      do {
        iVar14 = iVar7;
        iVar7 = (int)uVar8;
        uVar8 = (long)iVar11 * (long)(this->P).a[2] + (long)iVar14 * (long)(this->P).a[1] +
                (long)iVar7 * (long)(this->P).a[0];
        uVar8 = (uVar8 >> 0x1f) + (uVar8 & 0x7fffffff);
        uVar9 = uVar8 - 0xfffffffe;
        if (uVar8 < 0xfffffffe) {
          uVar9 = uVar8;
        }
        uVar8 = (ulong)((int)uVar9 + 0x80000001);
        if (uVar9 < 0x7fffffff) {
          uVar8 = uVar9 & 0xffffffff;
        }
        uVar5 = uVar5 - 1;
        iVar11 = iVar14;
      } while (uVar5 != 0);
      (this->S).r[0] = (int)uVar8;
      (this->S).r[1] = iVar7;
      (this->S).r[2] = iVar14;
    }
    else {
      uVar5 = 0;
      uVar8 = uVar4;
      do {
        if ((uVar8 & 1) != 0) {
          jump2(this,uVar5);
        }
        uVar5 = uVar5 + 1;
        bVar16 = 1 < uVar8;
        uVar8 = uVar8 >> 1;
      } while (bVar16);
      uVar8 = (ulong)(uint)(this->S).r[0];
    }
    iVar12 = (int32_t)uVar8;
    if (s < 0x10) {
      iVar7 = (this->S).r[1];
      iVar11 = (this->S).r[2];
      do {
        iVar14 = iVar7;
        iVar7 = (int)uVar8;
        uVar4 = (long)iVar11 * (long)(this->P).a[2] + (long)iVar14 * (long)(this->P).a[1] +
                (long)iVar7 * (long)(this->P).a[0];
        uVar8 = (uVar4 >> 0x1f) + (uVar4 & 0x7fffffff);
        uVar4 = uVar8 - 0xfffffffe;
        if (uVar8 < 0xfffffffe) {
          uVar4 = uVar8;
        }
        uVar8 = (ulong)((int)uVar4 + 0x80000001);
        if (uVar4 < 0x7fffffff) {
          uVar8 = uVar4 & 0xffffffff;
        }
        local_38 = (int)uVar8;
        s = s - 1;
        iVar11 = iVar14;
      } while (s != 0);
      (this->S).r[0] = local_38;
      (this->S).r[1] = iVar7;
      (this->S).r[2] = iVar14;
    }
    else {
      uVar5 = 0;
      do {
        if ((uVar4 & 1) != 0) {
          jump2(this,uVar5);
        }
        uVar5 = uVar5 + 1;
        bVar16 = 1 < uVar4;
        uVar4 = uVar4 >> 1;
      } while (bVar16);
      local_38 = (this->S).r[0];
    }
    local_68 = iVar2;
    local_64 = iVar3;
    local_60 = uVar13;
    local_5c = iVar15;
    local_58 = iVar2;
    local_54 = iVar3;
    local_50 = iVar12;
    local_4c = iVar15;
    local_48 = iVar2;
    local_40 = iVar15;
    iStack_3c = iVar12;
    int_math::gauss<3>((int32_t (*) [9])&local_68,(int32_t (*) [3])&local_40,0x7fffffff);
    *(ulong *)(this->P).a = CONCAT44(iStack_3c,local_40);
    (this->P).a[2] = local_38;
    (this->S).r[0] = iVar2;
    (this->S).r[1] = iVar3;
    (this->S).r[2] = uVar13;
    iVar3 = 3;
    do {
      backward(this);
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
  }
  return;
}

Assistant:

TRNG_CUDA_ENABLE
  inline void yarn3::split(unsigned int s, unsigned int n) {
#if !(defined TRNG_CUDA)
    if (s < 1 or n >= s)
      utility::throw_this(std::invalid_argument("invalid argument for trng::yarn3::split"));
#endif
    if (s > 1) {
      jump(n + 1ull);
      const int32_t q0{S.r[0]};
      jump(s);
      const int32_t q1{S.r[0]};
      jump(s);
      const int32_t q2{S.r[0]};
      jump(s);
      const int32_t q3{S.r[0]};
      jump(s);
      const int32_t q4{S.r[0]};
      jump(s);
      const int32_t q5{S.r[0]};
      int32_t a[3], b[9];
      a[0] = q3;
      b[0] = q2;
      b[1] = q1;
      b[2] = q0;
      a[1] = q4;
      b[3] = q3;
      b[4] = q2;
      b[5] = q1;
      a[2] = q5;
      b[6] = q4;
      b[7] = q3;
      b[8] = q2;
      int_math::gauss<3>(b, a, modulus);
      P.a[0] = a[0];
      P.a[1] = a[1];
      P.a[2] = a[2];
      S.r[0] = q2;
      S.r[1] = q1;
      S.r[2] = q0;
      for (int i{0}; i < 3; ++i)
        backward();
    }
  }